

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nonrd_pickmode.c
# Opt level: O0

void calculate_variance(int bw,int bh,TX_SIZE tx_size,uint *sse_i,int *sum_i,uint *var_o,uint *sse_o
                       ,int *sum_o)

{
  BLOCK_SIZE BVar1;
  uint8_t uVar2;
  int iVar3;
  int k;
  int col;
  int row;
  int nh;
  int nw;
  BLOCK_SIZE unit_size;
  uint *var_o_local;
  int *sum_i_local;
  uint *sse_i_local;
  TX_SIZE tx_size_local;
  int bh_local;
  int bw_local;
  
  BVar1 = txsize_to_bsize[tx_size];
  iVar3 = 1 << ((char)bw - ""[BVar1] & 0x1f);
  uVar2 = ""[BVar1];
  k = 0;
  for (row = 0; row < 1 << ((char)bh - uVar2 & 0x1f); row = row + 2) {
    for (col = 0; col < iVar3; col = col + 2) {
      sse_o[k] = sse_i[row * iVar3 + col] + sse_i[row * iVar3 + col + 1] +
                 sse_i[(row + 1) * iVar3 + col] + sse_i[(row + 1) * iVar3 + col + 1];
      sum_o[k] = sum_i[row * iVar3 + col] + sum_i[row * iVar3 + col + 1] +
                 sum_i[(row + 1) * iVar3 + col] + sum_i[(row + 1) * iVar3 + col + 1];
      var_o[k] = sse_o[k] -
                 (int)((long)sum_o[k] * (long)sum_o[k] >> (""[BVar1] + ""[BVar1] + 6 & 0x3f));
      k = k + 1;
    }
  }
  return;
}

Assistant:

static void calculate_variance(int bw, int bh, TX_SIZE tx_size,
                               unsigned int *sse_i, int *sum_i,
                               unsigned int *var_o, unsigned int *sse_o,
                               int *sum_o) {
  const BLOCK_SIZE unit_size = txsize_to_bsize[tx_size];
  const int nw = 1 << (bw - b_width_log2_lookup[unit_size]);
  const int nh = 1 << (bh - b_height_log2_lookup[unit_size]);
  int row, col, k = 0;

  for (row = 0; row < nh; row += 2) {
    for (col = 0; col < nw; col += 2) {
      sse_o[k] = sse_i[row * nw + col] + sse_i[row * nw + col + 1] +
                 sse_i[(row + 1) * nw + col] + sse_i[(row + 1) * nw + col + 1];
      sum_o[k] = sum_i[row * nw + col] + sum_i[row * nw + col + 1] +
                 sum_i[(row + 1) * nw + col] + sum_i[(row + 1) * nw + col + 1];
      var_o[k] = sse_o[k] - (uint32_t)(((int64_t)sum_o[k] * sum_o[k]) >>
                                       (b_width_log2_lookup[unit_size] +
                                        b_height_log2_lookup[unit_size] + 6));
      k++;
    }
  }
}